

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O1

void __thiscall
icu_63::UnicodeString::UnicodeString(UnicodeString *this,UnicodeString *that,int32_t srcStart)

{
  short sVar1;
  int iVar2;
  int32_t length;
  int32_t iVar3;
  
  (this->super_Replaceable).super_UObject._vptr_UObject = (_func_int **)&PTR__UnicodeString_003b5258
  ;
  (this->fUnion).fStackFields.fLengthAndFlags = 2;
  if (srcStart < 0) {
    srcStart = 0;
  }
  else {
    sVar1 = (that->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar2 = (that->fUnion).fFields.fLength;
    }
    else {
      iVar2 = (int)sVar1 >> 5;
    }
    if (iVar2 < srcStart) {
      srcStart = iVar2;
    }
  }
  sVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    length = (this->fUnion).fFields.fLength;
  }
  else {
    length = (int)sVar1 >> 5;
  }
  sVar1 = (that->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar3 = (that->fUnion).fFields.fLength;
  }
  else {
    iVar3 = (int)sVar1 >> 5;
  }
  doReplace(this,0,length,that,srcStart,iVar3 - srcStart);
  return;
}

Assistant:

UnicodeString::UnicodeString(const UnicodeString& that,
                             int32_t srcStart) {
  fUnion.fFields.fLengthAndFlags = kShortString;
  setTo(that, srcStart);
}